

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall
chrono::ChAparticle::ComputeJacobianForRollingContactPart
          (ChAparticle *this,ChVector<double> *abs_point,ChMatrix33<double> *contact_plane,
          type_constraint_tuple *jacobian_tuple_N,type_constraint_tuple *jacobian_tuple_U,
          type_constraint_tuple *jacobian_tuple_V,bool second)

{
  ChRowVectorN<double,_ChVariableTupleCarrier_1vars<6>::nvars1> *pCVar1;
  double *pdVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  ChMatrix33<double> Jr1;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> local_c9;
  DstXprType local_c8;
  plainobjectbase_evaluator_data<double,_3> local_80;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_78;
  SrcEvaluatorType local_58;
  
  local_78.m_src = &local_58;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = &(this->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
            super_Matrix<double,_3,_3,_1,_3,_3>;
  local_80.data = (double *)&local_c8;
  local_78.m_dst = (DstEvaluatorType *)&local_80;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 3;
  local_78.m_functor = &local_c9;
  local_78.m_dstExpr = (DstXprType *)local_80.data;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.m_matrix = &contact_plane->super_Matrix<double,_3,_3,_1,_3,_3>;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.
  super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
          )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )contact_plane;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
         local_58.
         super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_rhs;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_78);
  if (!second) {
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0].
    _4_4_ = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[0]._4_4_ ^ 0x80000000;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1].
    _4_4_ = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[1]._4_4_ ^ 0x80000000;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2].
    _4_4_ = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2]._4_4_ ^ 0x80000000;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3].
    _4_4_ = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[3]._4_4_ ^ 0x80000000;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4].
    _4_4_ = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[4]._4_4_ ^ 0x80000000;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5].
    _4_4_ = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[5]._4_4_ ^ 0x80000000;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6].
    _4_4_ = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[6]._4_4_ ^ 0x80000000;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
    _4_4_ = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[7]._4_4_ ^ 0x80000000;
    auVar7._0_8_ = -local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                    m_data.array[8];
    auVar7._8_4_ = 0;
    auVar7._12_4_ = 0x80000000;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
         = (double)vmovlps_avx(auVar7);
  }
  pCVar1 = &jacobian_tuple_N->Cq;
  uVar3 = -((uint)((ulong)pCVar1 >> 3) & 0x1fffffff) & 6;
  uVar5 = 3;
  if (uVar3 < 3) {
    uVar5 = uVar3;
  }
  if (uVar3 == 0) {
    sVar4 = 0x18;
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(uVar5 * 8);
    memset(pCVar1,0,uVar6);
    sVar4 = uVar6 ^ 0x18;
  }
  if (uVar5 != 3) {
    memset((void *)((long)(pCVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>).
                          m_storage.m_data.array + uVar6),0,sVar4);
  }
  pCVar1 = &jacobian_tuple_U->Cq;
  uVar3 = -((uint)((ulong)pCVar1 >> 3) & 0x1fffffff) & 6;
  uVar5 = 3;
  if (uVar3 < 3) {
    uVar5 = uVar3;
  }
  if (uVar3 == 0) {
    sVar4 = 0x18;
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(uVar5 * 8);
    memset(pCVar1,0,uVar6);
    sVar4 = uVar6 ^ 0x18;
  }
  if (uVar5 != 3) {
    memset((void *)((long)(pCVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>).
                          m_storage.m_data.array + uVar6),0,sVar4);
  }
  pCVar1 = &jacobian_tuple_V->Cq;
  uVar3 = -((uint)((ulong)pCVar1 >> 3) & 0x1fffffff) & 6;
  uVar5 = 3;
  if (uVar3 < 3) {
    uVar5 = uVar3;
  }
  if (uVar3 == 0) {
    sVar4 = 0x18;
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(uVar5 * 8);
    memset(pCVar1,0,uVar6);
    sVar4 = uVar6 ^ 0x18;
  }
  if (uVar5 != 3) {
    memset((void *)((long)(pCVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>).
                          m_storage.m_data.array + uVar6),0,sVar4);
  }
  pdVar2 = (jacobian_tuple_N->Cq).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
           m_storage.m_data.array + 3;
  uVar3 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar3 < 3) {
    uVar5 = uVar3;
  }
  uVar6 = (ulong)(uVar5 << 3);
  memcpy(pdVar2,&local_c8,uVar6);
  if (uVar3 < 3) {
    memcpy((void *)((long)(jacobian_tuple_N->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar6 + 0x18),
           (void *)((long)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array + uVar6),0x18 - uVar6);
  }
  pdVar2 = (jacobian_tuple_U->Cq).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
           m_storage.m_data.array + 3;
  uVar3 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar3 < 3) {
    uVar5 = uVar3;
  }
  uVar6 = (ulong)(uVar5 << 3);
  memcpy(pdVar2,local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array + 3,uVar6);
  if (uVar3 < 3) {
    memcpy((void *)((long)(jacobian_tuple_U->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar6 + 0x18),
           (void *)((long)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array + uVar6 + 0x18),0x18 - uVar6);
  }
  pdVar2 = (jacobian_tuple_V->Cq).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
           m_storage.m_data.array + 3;
  uVar3 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar3 < 3) {
    uVar5 = uVar3;
  }
  uVar6 = (ulong)(uVar5 << 3);
  memcpy(pdVar2,local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array + 6,uVar6);
  if (uVar3 < 3) {
    memcpy((void *)((long)(jacobian_tuple_V->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar6 + 0x18),
           (void *)((long)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array + uVar6 + 0x30),0x18 - uVar6);
  }
  return;
}

Assistant:

void ChAparticle::ComputeJacobianForRollingContactPart(
    const ChVector<>& abs_point,
    ChMatrix33<>& contact_plane,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_N,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_U,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_V,
    bool second) {
    ChMatrix33<> Jr1 = contact_plane.transpose() * this->GetA();
    if (!second)
        Jr1 *= -1;

    jacobian_tuple_N.Get_Cq().segment(0, 3).setZero();
    jacobian_tuple_U.Get_Cq().segment(0, 3).setZero();
    jacobian_tuple_V.Get_Cq().segment(0, 3).setZero();
    jacobian_tuple_N.Get_Cq().segment(3, 3) = Jr1.row(0);
    jacobian_tuple_U.Get_Cq().segment(3, 3) = Jr1.row(1);
    jacobian_tuple_V.Get_Cq().segment(3, 3) = Jr1.row(2);
}